

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O3

MPP_RET mpp_ops_dec_put_pkt(MppDump info,MppPacket pkt)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  undefined8 in_RAX;
  undefined8 uVar2;
  size_t sVar3;
  void *__ptr;
  MppDumpImpl *p;
  
  uVar2 = CONCAT71((int7)((ulong)in_RAX >> 8),info == (MppDump)0x0);
  if ((pkt != (MppPacket)0x0 && info != (MppDump)0x0) && (*(long *)((long)info + 0x28) != 0)) {
    sVar3 = mpp_packet_get_length(pkt);
    __mutex = *info;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    if (*(long *)((long)info + 0x28) != 0) {
      __ptr = mpp_packet_get_data(pkt);
      fwrite(__ptr,1,sVar3 & 0xffffffff,*(FILE **)((long)info + 0x28));
      fflush(*(FILE **)((long)info + 0x28));
    }
    if (*(FILE **)((long)info + 0x38) != (FILE *)0x0) {
      uVar1 = *(uint *)((long)info + 0x58);
      *(uint *)((long)info + 0x58) = uVar1 + 1;
      _ops_log(*(FILE **)((long)info + 0x38),"%d,%s,%d,%d\n",(ulong)uVar1,"pkt",
               (ulong)*(uint *)((long)info + 0x48),sVar3 & 0xffffffff,uVar2);
      *(int *)((long)info + 0x48) = *(int *)((long)info + 0x48) + (int)sVar3;
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_ops_dec_put_pkt(MppDump info, MppPacket pkt)
{
    MppDumpImpl *p = (MppDumpImpl *)info;
    if (NULL == p || NULL == pkt || NULL == p->fp_in)
        return MPP_OK;

    RK_U32 length = mpp_packet_get_length(pkt);
    AutoMutex auto_lock(p->lock);

    if (p->fp_in) {
        fwrite(mpp_packet_get_data(pkt), 1, length, p->fp_in);
        fflush(p->fp_in);
    }

    if (p->fp_ops) {
        ops_log(p->fp_ops, "%d,%s,%d,%d\n", p->idx++, "pkt", p->pkt_offset, length);

        p->pkt_offset += length;
    }

    return MPP_OK;
}